

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

Real Q_GetEl(QMatrix *Q,size_t Row,size_t Clm)

{
  LASErrIdType LVar1;
  ElType *local_40;
  ElType *PtrEl;
  size_t ElCount;
  size_t Len;
  Real Val;
  size_t Clm_local;
  size_t Row_local;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((((Row == 0) || (Q->Dim < Row)) || (Clm == 0)) || (Q->Dim < Clm)) {
      LASError(LASRangeErr,"Q_GetEl",Q->Name,(char *)0x0,(char *)0x0);
      Len = 0;
    }
    else {
      Len = 0;
      if ((Q->Symmetry == False) || (Q->ElOrder != Rowws)) {
        if ((Q->Symmetry == False) || (Q->ElOrder != Clmws)) {
          if ((Q->Symmetry == False) && (Q->ElOrder == Rowws)) {
            local_40 = Q->El[Row];
            for (PtrEl = (ElType *)Q->Len[Row]; PtrEl != (ElType *)0x0;
                PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
              if (local_40->Pos == Clm) {
                Len = (size_t)local_40->Val;
              }
              local_40 = local_40 + 1;
            }
          }
          else if ((Q->Symmetry == False) && (Q->ElOrder == Clmws)) {
            local_40 = Q->El[Clm];
            for (PtrEl = (ElType *)Q->Len[Clm]; PtrEl != (ElType *)0x0;
                PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
              if (local_40->Pos == Row) {
                Len = (size_t)local_40->Val;
              }
              local_40 = local_40 + 1;
            }
          }
        }
        else if (Clm < Row) {
          local_40 = Q->El[Row];
          for (PtrEl = (ElType *)Q->Len[Row]; PtrEl != (ElType *)0x0;
              PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
            if (local_40->Pos == Clm) {
              Len = (size_t)local_40->Val;
            }
            local_40 = local_40 + 1;
          }
        }
        else {
          local_40 = Q->El[Clm];
          for (PtrEl = (ElType *)Q->Len[Clm]; PtrEl != (ElType *)0x0;
              PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
            if (local_40->Pos == Row) {
              Len = (size_t)local_40->Val;
            }
            local_40 = local_40 + 1;
          }
        }
      }
      else if (Clm < Row) {
        local_40 = Q->El[Clm];
        for (PtrEl = (ElType *)Q->Len[Clm]; PtrEl != (ElType *)0x0;
            PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
          if (local_40->Pos == Row) {
            Len = (size_t)local_40->Val;
          }
          local_40 = local_40 + 1;
        }
      }
      else {
        local_40 = Q->El[Row];
        for (PtrEl = (ElType *)Q->Len[Row]; PtrEl != (ElType *)0x0;
            PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
          if (local_40->Pos == Clm) {
            Len = (size_t)local_40->Val;
          }
          local_40 = local_40 + 1;
        }
      }
      if (Row == 1) {
        Len = (size_t)(Q->MultiplD * (double)Len);
      }
      if (Clm < Row) {
        Len = (size_t)(Q->MultiplL * Q->MultiplU * (double)Len);
      }
    }
  }
  else {
    Len = 0;
  }
  return (Real)Len;
}

Assistant:

Real Q_GetEl(QMatrix *Q, size_t Row, size_t Clm)
/* returns the value of a matrix element (all matrix elements are considered) */
{
    Real Val;
    
    size_t Len, ElCount;
    ElType *PtrEl;

    if (LASResult() == LASOK) {
        if (Row > 0 && Row <= Q->Dim && Clm > 0 && Clm <= Q->Dim) {
            Val = 0.0;
            if (Q->Symmetry && Q->ElOrder == Rowws) {
                if (Clm >= Row) {
                    Len = Q->Len[Row];
                    PtrEl = Q->El[Row];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Clm)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                } else {
                    Len = Q->Len[Clm];
                    PtrEl = Q->El[Clm];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Row)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                }
            } else if (Q->Symmetry && Q->ElOrder == Clmws) {
                if (Clm >= Row) {
                    Len = Q->Len[Clm];
                    PtrEl = Q->El[Clm];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Row)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                } else {
                    Len = Q->Len[Row];
                    PtrEl = Q->El[Row];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Clm)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                }
            } else if (!Q->Symmetry && Q->ElOrder == Rowws) {
                Len = Q->Len[Row];
                PtrEl = Q->El[Row];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Clm)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            } else if (!Q->Symmetry && Q->ElOrder == Clmws) {
                Len = Q->Len[Clm];
                PtrEl = Q->El[Clm];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Row)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            }

            if (Row == Clmws)
                Val *= Q->MultiplD;
            if (Row > Clm)
                Val *= Q->MultiplU;
            if (Row > Clm)
                Val *= Q->MultiplL;
        } else {
            LASError(LASRangeErr, "Q_GetEl", Q->Name, NULL, NULL);
            Val = 0.0;
        }
    } else {
        Val = 0.0;
    }
    return(Val);
}